

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_35::InMemoryFile::MmapDisposer::disposeImpl
          (MmapDisposer *this,void *firstElement,size_t elementSize,size_t elementCount,
          size_t capacity,_func_void_void_ptr *destroyElement)

{
  _func_void_void_ptr *destroyElement_local;
  size_t capacity_local;
  size_t elementCount_local;
  size_t elementSize_local;
  void *firstElement_local;
  MmapDisposer *this_local;
  
  if (this != (MmapDisposer *)0x0) {
    ~MmapDisposer(this);
    operator_delete(this,0x18);
  }
  return;
}

Assistant:

void disposeImpl(void* firstElement, size_t elementSize, size_t elementCount,
                     size_t capacity, void (*destroyElement)(void*)) const override {
      delete this;
    }